

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson_dist.hpp
# Opt level: O1

void __thiscall trng::poisson_dist::param_type::calc_probabilities(param_type *this)

{
  pointer pdVar1;
  iterator iVar2;
  double in_RAX;
  uint uVar3;
  double local_28;
  
  pdVar1 = (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_28 = in_RAX;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  for (uVar3 = 1; (uVar3 - 1 < 7 || ((double)(int)(uVar3 - 1) < this->mu_ + this->mu_));
      uVar3 = uVar3 + 1) {
    local_28 = math::detail::GammaQ<double,true>((double)uVar3,this->mu_);
    iVar2._M_current =
         (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->P_,iVar2,&local_28);
    }
    else {
      *iVar2._M_current = local_28;
      (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar2._M_current + 1;
    }
  }
  local_28 = 1.0;
  iVar2._M_current =
       (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->P_,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = 1.0;
    (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void calc_probabilities() {
        P_ = std::vector<double>();
        int x = 0;
        while (x < 7 or x < 2 * mu_) {
          P_.push_back(math::GammaQ(x + 1.0, mu_));
          ++x;
        }
        P_.push_back(1);
      }